

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O2

void __thiscall
xLearn::DMATRIX_TEST_Serialize_and_Deserialize_Test::TestBody
          (DMATRIX_TEST_Serialize_and_Deserialize_Test *this)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  index_t row_id;
  size_t i;
  long lVar2;
  char *pcVar3;
  pointer expected;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertHelper local_c8;
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  DMatrix matrix;
  
  DMatrix::DMatrix(&matrix);
  DMatrix::Reset(&matrix);
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    DMatrix::AddRow(&matrix);
    row_id = (index_t)lVar2;
    DMatrix::AddNode(&matrix,row_id,row_id,2.5,row_id);
    matrix.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar2] = (float)lVar2;
    matrix.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar2] = 0.25;
  }
  matrix.hash_value_1 = 0x4d2;
  matrix.hash_value_2 = 0x162e;
  std::__cxx11::string::string((string *)&gtest_ar,"/tmp/test.bin",(allocator *)&local_d0);
  DMatrix::Serialize(&matrix,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  DMatrix::Reset(&matrix);
  local_d0.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"matrix.has_label","true",&matrix.has_label,(bool *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.hash_value_1","0",&matrix.hash_value_1,(int *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.hash_value_2","0",&matrix.hash_value_2,(int *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"matrix.row_length","0",&matrix.row_length,(int *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"matrix.pos","0",&matrix.pos,(int *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x66,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_c8.data_._0_1_ = 1;
  local_d0.ptr_._0_1_ =
       matrix.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       matrix.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"matrix.Y.empty()","true",(bool *)&local_d0,(bool *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_c8.data_._0_1_ = 1;
  local_d0.ptr_._0_1_ =
       matrix.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
       ._M_start ==
       matrix.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"matrix.norm.empty()","true",(bool *)&local_d0,(bool *)&local_c8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_c8.data_._0_1_ = 1;
  local_d0.ptr_._0_1_ =
       matrix.row.
       super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       matrix.row.
       super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"matrix.row.empty()","true",(bool *)&local_d0,(bool *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&gtest_ar,"/tmp/test.bin",(allocator *)&local_d0);
  DMatrix::Deserialize(&matrix,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"matrix.row_length","kLength",&matrix.row_length,&kLength);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_._0_4_ = 0x4d2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.hash_value_1","1234",&matrix.hash_value_1,
             (int *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_._0_4_ = 0x162e;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"matrix.hash_value_2","5678",&matrix.hash_value_2,
             (int *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d0.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"matrix.has_label","true",&matrix.has_label,(bool *)&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (local_d0.ptr_ =
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_d0.ptr_ < (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa
      ; local_d0.ptr_ = local_d0.ptr_ + 1) {
    testing::internal::CmpHelperEQ<float,unsigned_long>
              ((internal *)&gtest_ar,"matrix.Y[i]","i",
               matrix.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + (long)local_d0.ptr_,(unsigned_long *)&local_d0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
                 ,0x75,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_c8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_c8.data_ = (AssertHelperData *)0x3fd0000000000000;
    testing::internal::CmpHelperEQ<float,double>
              ((internal *)&gtest_ar,"matrix.norm[i]","0.25",
               matrix.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + (long)local_d0.ptr_,(double *)&local_c8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c8);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
                 ,0x76,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_c8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pvVar1 = matrix.row.
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)local_d0.ptr_];
    for (expected = (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        expected !=
        (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
        super__Vector_impl_data._M_finish; expected = expected + 1) {
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"iter->field_id","i",&expected->field_id,
                 (unsigned_long *)&local_d0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c8);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
                   ,0x7a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_c8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"iter->feat_id","i",&expected->feat_id,
                 (unsigned_long *)&local_d0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c8);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
                   ,0x7b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_c8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"iter->feat_val","2.5",expected->feat_val,2.5);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c8);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
                   ,0x7c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_c8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  RemoveFile("/tmp/test.bin");
  DMatrix::~DMatrix(&matrix);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Serialize_and_Deserialize) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  // Serialize
#ifndef _MSC_VER
  matrix.Serialize("/tmp/test.bin");
#else
  matrix.Serialize("../../test.bin");
#endif
  matrix.Reset();
  EXPECT_EQ(matrix.has_label, true);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, 0);
  EXPECT_EQ(matrix.pos, 0);
  EXPECT_EQ(matrix.Y.empty(), true);
  EXPECT_EQ(matrix.norm.empty(), true);
  EXPECT_EQ(matrix.row.empty(),true);
  // Deserialize
#ifndef _MSC_VER
  matrix.Deserialize("/tmp/test.bin");
#else
  matrix.Deserialize("../../test.bin");
#endif
  EXPECT_EQ(matrix.row_length, kLength);
  EXPECT_EQ(matrix.hash_value_1, 1234);
  EXPECT_EQ(matrix.hash_value_2, 5678);
  EXPECT_EQ(matrix.has_label, true);
  for (size_t i = 0; i < kLength; ++i) {
    EXPECT_EQ(matrix.Y[i], i);
    EXPECT_EQ(matrix.norm[i], 0.25);
    SparseRow *row = matrix.row[i];
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, i);
      EXPECT_EQ(iter->feat_id, i);
      EXPECT_FLOAT_EQ(iter->feat_val, 2.5);
    }
  }
#ifndef _MSC_VER
  RemoveFile("/tmp/test.bin");
#else
  RemoveFile("../../test.bin");
#endif
}